

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Liby::Connection::Connection(Connection *this,EventLoop *loop,SockPtr *socket)

{
  Poller *pPVar1;
  
  (this->super_enable_shared_from_this<Liby::Connection>)._M_weak_this.
  super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Liby::Connection>)._M_weak_this.
  super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__Connection_0012f828;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->destroy_ = false;
  pPVar1 = EventLoop::getPoller(loop);
  this->poller_ = pPVar1;
  this->loop_ = loop;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>,
             &socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Buffer::Buffer(&this->readBuf_,0x400);
  std::_Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>::_Deque_base
            (&(this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>);
  (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->erroEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
  (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->readEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->readEventCallback_).super__Function_base._M_functor + 8) = 0;
  if ((socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  __assert_fail("socket",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp"
                ,0xc,"Liby::Connection::Connection(EventLoop *, const SockPtr &)");
}

Assistant:

Connection::Connection(EventLoop *loop, const SockPtr &socket)
    : poller_(loop->getPoller()), loop_(loop), socket_(socket), readBuf_(1024) {
    assert(socket);
}